

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scan.h
# Opt level: O3

triplet<unsigned_short> __thiscall
charls::
jls_codec<charls::default_traits<unsigned_short,_charls::triplet<unsigned_short>_>,_charls::encoder_strategy>
::encode_run_interruption_pixel
          (jls_codec<charls::default_traits<unsigned_short,_charls::triplet<unsigned_short>_>,_charls::encoder_strategy>
           *this,triplet<unsigned_short> x,triplet<unsigned_short> ra,triplet<unsigned_short> rb)

{
  array<charls::context_run_mode,_2UL> *context;
  int iVar1;
  unsigned_short uVar2;
  unsigned_short uVar3;
  uint uVar4;
  int iVar5;
  int32_t error_value;
  int32_t error_value_00;
  int32_t error_value_01;
  triplet<unsigned_short> tVar6;
  uint uVar7;
  uint uVar8;
  default_traits<unsigned_short,_charls::triplet<unsigned_short>_> *this_00;
  int iVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  
  uVar11 = rb._0_4_ >> 0x10;
  uVar4 = (uint)rb.field_2.v3;
  this_00 = &this->traits_;
  uVar7 = rb._0_4_ & 0xffff;
  uVar10 = -(uint)(uVar7 < (ra._0_4_ & 0xffff)) | 1;
  iVar9 = ((x._0_4_ & 0xffff) - uVar7) * uVar10;
  iVar1 = (this->traits_).near_lossless;
  iVar5 = -iVar1;
  if (0 < iVar9) {
    iVar5 = iVar1;
  }
  error_value = default_traits<unsigned_short,_charls::triplet<unsigned_short>_>::modulo_range
                          (this_00,(iVar5 + iVar9) / (iVar1 * 2 + 1));
  context = &this->context_run_mode_;
  encode_run_interruption_error(this,context->_M_elems,error_value);
  uVar12 = -(uint)(uVar11 < (ra._2_4_ & 0xffff)) | 1;
  iVar9 = ((x._0_4_ >> 0x10) - uVar11) * uVar12;
  iVar1 = (this->traits_).near_lossless;
  iVar5 = -iVar1;
  if (0 < iVar9) {
    iVar5 = iVar1;
  }
  error_value_00 =
       default_traits<unsigned_short,_charls::triplet<unsigned_short>_>::modulo_range
                 (this_00,(iVar5 + iVar9) / (iVar1 * 2 + 1));
  encode_run_interruption_error(this,context->_M_elems,error_value_00);
  uVar8 = -(uint)(uVar4 < ra.field_2.v3) | 1;
  iVar9 = (x.field_2.v3 - uVar4) * uVar8;
  iVar1 = (this->traits_).near_lossless;
  iVar5 = -iVar1;
  if (0 < iVar9) {
    iVar5 = iVar1;
  }
  error_value_01 =
       default_traits<unsigned_short,_charls::triplet<unsigned_short>_>::modulo_range
                 (this_00,(iVar5 + iVar9) / (iVar1 * 2 + 1));
  encode_run_interruption_error(this,context->_M_elems,error_value_01);
  tVar6.field_0.v1 =
       default_traits<unsigned_short,_charls::triplet<unsigned_short>_>::fix_reconstructed_value
                 (this_00,((this->traits_).near_lossless * 2 + 1) * uVar10 * error_value + uVar7);
  uVar2 = default_traits<unsigned_short,_charls::triplet<unsigned_short>_>::fix_reconstructed_value
                    (this_00,((this->traits_).near_lossless * 2 + 1) * uVar12 * error_value_00 +
                             uVar11);
  uVar3 = default_traits<unsigned_short,_charls::triplet<unsigned_short>_>::fix_reconstructed_value
                    (this_00,((this->traits_).near_lossless * 2 + 1) * uVar8 * error_value_01 +
                             uVar4);
  tVar6.field_2.v3 = uVar3;
  tVar6.field_1.v2 = uVar2;
  return tVar6;
}

Assistant:

triplet<sample_type> encode_run_interruption_pixel(const triplet<sample_type> x, const triplet<sample_type> ra,
                                                       const triplet<sample_type> rb)
    {
        const int32_t error_value1{traits_.compute_error_value(sign(rb.v1 - ra.v1) * (x.v1 - rb.v1))};
        encode_run_interruption_error(context_run_mode_[0], error_value1);

        const int32_t error_value2{traits_.compute_error_value(sign(rb.v2 - ra.v2) * (x.v2 - rb.v2))};
        encode_run_interruption_error(context_run_mode_[0], error_value2);

        const int32_t error_value3{traits_.compute_error_value(sign(rb.v3 - ra.v3) * (x.v3 - rb.v3))};
        encode_run_interruption_error(context_run_mode_[0], error_value3);

        return triplet<sample_type>(traits_.compute_reconstructed_sample(rb.v1, error_value1 * sign(rb.v1 - ra.v1)),
                                    traits_.compute_reconstructed_sample(rb.v2, error_value2 * sign(rb.v2 - ra.v2)),
                                    traits_.compute_reconstructed_sample(rb.v3, error_value3 * sign(rb.v3 - ra.v3)));
    }